

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fix-qdf.cc
# Opt level: O0

void __thiscall QdfFixer::adjustOstreamXref(QdfFixer *this)

{
  int iVar1;
  int iVar2;
  reference pvVar3;
  size_t local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined4 local_18;
  QdfFixer *local_10;
  QdfFixer *this_local;
  
  iVar1 = this->ostream_id;
  local_30 = this->ostream_idx;
  this->ostream_idx = local_30 + 1;
  local_10 = this;
  iVar2 = QIntC::to_int<unsigned_long>(&local_30);
  QPDFXRefEntry::QPDFXRefEntry((QPDFXRefEntry *)&local_28,2,(long)iVar1,iVar2);
  pvVar3 = std::vector<QPDFXRefEntry,_std::allocator<QPDFXRefEntry>_>::back(&this->xref);
  *(undefined8 *)pvVar3 = local_28;
  *(undefined8 *)(pvVar3 + 8) = local_20;
  *(undefined4 *)(pvVar3 + 0x10) = local_18;
  return;
}

Assistant:

void
QdfFixer::adjustOstreamXref()
{
    xref.back() = QPDFXRefEntry(2, ostream_id, QIntC::to_int(ostream_idx++));
}